

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal.h
# Opt level: O2

int CRYPTO_cpu_perf_is_like_silvermont(void)

{
  uint32_t uVar1;
  uint uVar2;
  int iVar3;
  
  uVar1 = OPENSSL_get_ia32cap(1);
  uVar2 = 0;
  if ((uVar1 >> 0x1a & 1) == 0) {
    iVar3 = CRYPTO_is_MOVBE_capable();
    uVar2 = (uint)(iVar3 != 0);
  }
  return uVar2;
}

Assistant:

inline int CRYPTO_cpu_perf_is_like_silvermont(void) {
  // WARNING: This MUST NOT be used to guard the execution of the XSAVE
  // instruction. This is the "hardware supports XSAVE" bit, not the OSXSAVE bit
  // that indicates whether we can safely execute XSAVE. This bit may be set
  // even when XSAVE is disabled (by the operating system). See how the users of
  // this bit use it.
  //
  // Historically, the XSAVE bit was artificially cleared on Knights Landing
  // and Knights Mill chips, but as Intel has removed all support from GCC,
  // LLVM, and SDE, we assume they are no longer worth special-casing.
  int hardware_supports_xsave = (OPENSSL_get_ia32cap(1) & (1u << 26)) != 0;
  return !hardware_supports_xsave && CRYPTO_is_MOVBE_capable();
}